

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void check(QPDFMatrix *m,string *exp)

{
  bool bVar1;
  ostream *poVar2;
  string u;
  string local_30;
  
  QPDFMatrix::unparse_abi_cxx11_(&local_30,m);
  bVar1 = std::operator!=(&local_30,exp);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"got ");
    poVar2 = std::operator<<(poVar2,(string *)&local_30);
    poVar2 = std::operator<<(poVar2,", wanted ");
    poVar2 = std::operator<<(poVar2,(string *)exp);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void
check(QPDFMatrix const& m, std::string const& exp)
{
    std::string u = m.unparse();
    if (u != exp) {
        std::cout << "got " << u << ", wanted " << exp << std::endl;
    }
}